

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkexmlParser.cpp
# Opt level: O3

void SkexmlParser::WriteNode(stringstream *xml_string,shared_ptr<Node> *node,ofstream *file)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  Node *this;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  children;
  string value;
  string node_name;
  string list;
  shared_ptr<Node> local_148;
  undefined1 local_138 [32];
  shared_ptr<Node> *local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  stringstream *local_c0;
  ofstream *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = file;
  Node::GetName_abi_cxx11_
            (&local_b0,(node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  poVar8 = (ostream *)(xml_string + 0x10);
  local_c0 = xml_string;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
  this = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"List","");
  Node::GetAttribute(&local_90,this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_90);
  local_118 = node;
  if (iVar4 == 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_110,
               &(((node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_attributes)
                ._M_t);
    p_Var2 = &local_110._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_110._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var6 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_138._0_8_ = (pointer)(local_138 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        iVar4 = std::__cxx11::string::compare((char *)local_138);
        if (iVar4 != 0) {
          local_e0 = local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,*(long *)(p_Var6 + 2),
                     (long)&(p_Var6[2]._M_parent)->_M_color + *(long *)(p_Var6 + 2));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_138._0_8_,local_138._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_e0,local_d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[/",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_138._0_8_,local_138._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
          if (local_e0 != local_d0) {
            operator_delete(local_e0);
          }
        }
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var2);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_110);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    Tokenizer::GetAllTokens
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,&local_70,';');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_138._0_8_ != local_138._8_8_) {
      pp_Var1 = &local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
      pbVar9 = (pointer)local_138._0_8_;
      do {
        pcVar3 = (pbVar9->_M_dataplus)._M_p;
        local_110._M_impl._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar3,pcVar3 + pbVar9->_M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_110._M_impl._0_8_,
                            local_110._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
        if ((_Base_ptr *)local_110._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_110._M_impl._0_8_);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (pointer)local_138._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
              *)&local_110,
             &(((local_118->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_children
              )._M_t);
  p_Var7 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 == &local_110._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[/",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
                   *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      return;
    }
    local_148.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(p_Var7 + 2);
    p_Var6 = p_Var7[2]._M_parent;
    if (p_Var6 == (_Base_ptr)0x0) {
      local_148.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_148.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
          UNLOCK();
          goto LAB_0015533e;
        }
      }
      else {
        *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
      }
      *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
    }
LAB_0015533e:
    WriteNode(local_c0,&local_148,local_b8);
    if ((_Base_ptr)local_148.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (p_Var6 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6);
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void SkexmlParser::WriteNode(std::stringstream &xml_string, std::shared_ptr<Node> node, std::ofstream &file) {
    std::string node_name = node->GetName();
    xml_string << "[" << node_name << "]" << "\r\n";
    std::string list = node->GetAttribute("List");
    if(list != "") {
        auto items = Tokenizer::GetAllTokens(list, ';');
        for(auto item : items)
        {
            xml_string << item << "\r\n";
        }
    }
    else {
        std::map<std::string, std::string> attributes = node->GetAttributes();
        for (auto &kv : attributes) {
            std::string name = kv.first;
            if(name=="List")
                continue;
            std::string value = kv.second;
            xml_string << "[" << name << "]" << value << "[/" << name << "]" << "\r\n";
        }
    }
    std::map<std::string, std::shared_ptr<Node>> children = node->GetChildren();
    for(auto &kv : children)
    {
        std::shared_ptr<Node> value = kv.second;
        WriteNode(xml_string, value, file);
    }
    xml_string << "[/" << node_name << "]" << "\r\n";
}